

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

Hash Fossilize::Hashing::compute_hash_physical_device_features(void *device_pnext)

{
  int *piVar1;
  uint uVar2;
  VkBaseInStructure *base_in;
  int *piVar3;
  uint *pNext;
  uint *puVar4;
  Hash HVar5;
  ulong uVar6;
  size_type __dnew;
  size_type local_50;
  string local_48;
  
  HVar5 = 0xaf63bd4c8601b7df;
  piVar3 = (int *)device_pnext;
  if (device_pnext != (void *)0x0) {
    do {
      if (*piVar3 == 0x3b9bb078) {
        HVar5 = (ulong)(uint)piVar3[4] ^ 0xaf63bd4c8601b7df;
        break;
      }
      piVar1 = piVar3 + 2;
      piVar3 = *(int **)piVar1;
    } while (*(int **)piVar1 != (int *)0x0);
  }
  pNext = (uint *)pnext_chain_pdf2_skip_ignored_entries(device_pnext);
  do {
    if (pNext == (uint *)0x0) {
      return HVar5;
    }
    uVar2 = *pNext;
    uVar6 = HVar5 * 0x100000001b3 ^ (ulong)uVar2;
    if ((int)uVar2 < 0x3b9fcb40) {
      if ((int)uVar2 < 0x3b9f2730) {
        if (uVar2 != 0x3b9ddf10) {
          if (uVar2 != 0x3b9e3cd3) {
LAB_0011c145:
            local_50 = 0x25;
            local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
            local_48._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
            local_48.field_2._M_allocated_capacity = local_50;
            builtin_strncpy(local_48._M_dataplus._M_p,"Unsupported pNext found, cannot hash.",0x25);
            local_48._M_string_length = local_50;
            local_48._M_dataplus._M_p[local_50] = '\0';
            log_error_pnext_chain(&local_48,pNext);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_48._M_dataplus._M_p == &local_48.field_2) {
              return uVar6;
            }
            operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
            return uVar6;
          }
          goto LAB_0011c058;
        }
LAB_0011c092:
        puVar4 = pNext + 5;
        uVar6 = uVar6 * 0x100000001b3 ^ (ulong)pNext[4];
      }
      else if (uVar2 == 0x3b9f2730) {
LAB_0011c058:
        uVar6 = (uVar6 * 0x100000001b3 ^ (ulong)pNext[4]) * 0x100000001b3 ^ (ulong)pNext[5];
        puVar4 = pNext + 6;
      }
      else {
        if (uVar2 != 0x3b9f9c62) {
          if (uVar2 != 0x3b9fc371) goto LAB_0011c145;
          uVar6 = (uVar6 * 0x100000001b3 ^ (ulong)pNext[6]) * 0x100000001b3 ^ (ulong)pNext[4];
          goto LAB_0011c0e0;
        }
        uVar6 = ((uVar6 * 0x100000001b3 ^ (ulong)pNext[4]) * 0x100000001b3 ^ (ulong)pNext[5]) *
                0x100000001b3 ^ (ulong)pNext[6];
        puVar4 = pNext + 7;
      }
    }
    else if ((int)uVar2 < 0x3ba09e30) {
      if (uVar2 != 0x3b9fcb40) {
        if (uVar2 != 0x3b9fe698) goto LAB_0011c145;
        goto LAB_0011c089;
      }
      uVar6 = (((uVar6 * 0x100000001b3 ^ (ulong)pNext[4]) * 0x100000001b3 ^ (ulong)pNext[5]) *
               0x100000001b3 ^ (ulong)pNext[6]) * 0x100000001b3 ^ (ulong)pNext[7];
      puVar4 = pNext + 8;
    }
    else if (uVar2 == 0x3ba09e30) {
      uVar6 = (uVar6 * 0x100000001b3 ^ (ulong)pNext[4]) * 0x100000001b3 ^ (ulong)pNext[6];
LAB_0011c0e0:
      puVar4 = pNext + 5;
    }
    else {
      if (uVar2 == 0x3ba0c928) goto LAB_0011c092;
      if (uVar2 != 0x3ba224d0) goto LAB_0011c145;
LAB_0011c089:
      puVar4 = pNext + 4;
    }
    HVar5 = uVar6 * 0x100000001b3 ^ (ulong)*puVar4;
    pNext = (uint *)pnext_chain_pdf2_skip_ignored_entries(*(void **)(pNext + 2));
  } while( true );
}

Assistant:

static Hash compute_hash_physical_device_features(const void *device_pnext)
{
	Hasher h;

	// For hash invariance, make sure we hash PDF2 first, since when we serialize and unserialize,
	// PDF2 will always come first in the chain.
	auto *pdf2 = find_pnext<VkPhysicalDeviceFeatures2>(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2, device_pnext);
	if (pdf2)
		h.u32(pdf2->features.robustBufferAccess);
	else
		h.u32(0);

	hash_pnext_chain_pdf2(nullptr, h, device_pnext);
	return h.get();
}